

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_formatter.cpp
# Opt level: O0

size_t __thiscall
bidfx_public_api::price::subject::SubjectFormatter::NumericCharacterEntity::NextDecodedChar
          (NumericCharacterEntity *this,stringstream *ss,string *s,size_t start)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  char local_39;
  int code;
  char c;
  size_t i;
  size_t start_local;
  string *s_local;
  stringstream *ss_local;
  NumericCharacterEntity *this_local;
  
  pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
  if (*pcVar2 == '#') {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
    cVar1 = *pcVar2;
    if (('/' < cVar1) && (cVar1 < ':')) {
      cVar1 = cVar1 + -0x30;
      _code = start + 4;
      pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
      local_39 = *pcVar2;
      while ((local_39 < ':' && (lVar3 = std::__cxx11::string::length(), _code != lVar3))) {
        cVar1 = local_39 + -0x30 + cVar1 * '\n';
        _code = _code + 1;
        pcVar2 = (char *)std::__cxx11::string::at((ulong)s);
        local_39 = *pcVar2;
      }
      if (local_39 == ';') {
        std::operator<<((ostream *)(ss + 0x10),cVar1);
        return _code - 1;
      }
    }
  }
  std::operator<<((ostream *)(ss + 0x10),'&');
  return start;
}

Assistant:

size_t SubjectFormatter::NumericCharacterEntity::NextDecodedChar(std::stringstream &ss, std::string s, size_t start)
{
    size_t i = start + 1;
    char c = s.at(i++);

    if (c == '#')
    {
        c = s.at(i++);

        if (c >= '0' && c <= '9')
        {
            int code = c - '0';

            for (c = s.at(i++); c <= '9'; c = s.at(i++))
            {
                if (i == s.length()) { break; }

                code *= 10;
                code += c - '0';
            }

            if (c == ';')
            {
                ss << (char) code;
                return i - 1;
            }
        }
    }

    ss << '&';
    return start;
}